

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::mergeTrees(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermSequence *globals;
  undefined4 extraout_var_00;
  TIntermSequence *unitGlobals;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TPoolAllocator *pTVar4;
  undefined4 *puVar5;
  TMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *this_00;
  long lVar6;
  longlong idShift;
  TIdMaps idMaps;
  long local_160;
  TIdMaps local_158;
  undefined **local_78;
  undefined1 local_70;
  undefined7 local_6f;
  undefined4 uStack_68;
  TPoolAllocator *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  TIdMaps *local_40;
  long local_38;
  
  if (unit->treeRoot != (TIntermNode *)0x0) {
    if (this->treeRoot == (TIntermNode *)0x0) {
      this->treeRoot = unit->treeRoot;
    }
    else {
      this->numShaderRecordBlocks = this->numShaderRecordBlocks + unit->numShaderRecordBlocks;
      this->numTaskNVBlocks = this->numTaskNVBlocks + unit->numTaskNVBlocks;
      iVar1 = (*this->treeRoot->_vptr_TIntermNode[6])();
      globals = (TIntermSequence *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 400))
                          ((long *)CONCAT44(extraout_var,iVar1));
      iVar1 = (*unit->treeRoot->_vptr_TIntermNode[6])();
      unitGlobals = (TIntermSequence *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 400))
                              ((long *)CONCAT44(extraout_var_00,iVar1));
      pTVar3 = findLinkerObjects(this);
      iVar1 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(pTVar3);
      pTVar3 = findLinkerObjects(unit);
      iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(pTVar3);
      lVar6 = 0;
      do {
        pTVar4 = GetThreadPoolAllocator();
        puVar5 = (undefined4 *)
                 ((long)&local_158.maps[0].
                         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                         ._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar6);
        *(TPoolAllocator **)
         ((long)&local_158.maps[0].
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                 ._M_t._M_impl.super__Node_allocator.allocator + lVar6) = pTVar4;
        *puVar5 = 0;
        *(undefined8 *)
         ((long)&local_158.maps[0].
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar6) = 0;
        *(undefined4 **)
         ((long)&local_158.maps[0].
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_left + lVar6) = puVar5;
        *(undefined4 **)
         ((long)&local_158.maps[0].
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_header._M_right + lVar6) = puVar5;
        *(undefined8 *)
         ((long)&local_158.maps[0].
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar6) = 0;
        lVar6 = lVar6 + 0x38;
      } while (lVar6 != 0xe0);
      seedIdMap(this,&local_158,&local_160);
      local_70 = 1;
      local_6f = 0;
      uStack_68 = 0;
      local_60 = GetThreadPoolAllocator();
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      local_78 = &PTR__TIntermTraverser_00af6c10;
      local_40 = &local_158;
      local_38 = local_160 + 1;
      (*unit->treeRoot->_vptr_TIntermNode[2])(unit->treeRoot,&local_78);
      mergeBodies(this,infoSink,globals,unitGlobals);
      mergeGlobalUniformBlocks(this,infoSink,unit,false);
      mergeLinkerObjects(this,infoSink,(TIntermSequence *)CONCAT44(extraout_var_01,iVar1),
                         (TIntermSequence *)CONCAT44(extraout_var_02,iVar2),unit->language);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
      ::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                  *)&this->ioAccessed,
                 (unit->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                  )&(unit->ioAccessed)._M_t._M_impl.super__Rb_tree_header);
      lVar6 = -0xe0;
      this_00 = local_158.maps + 3;
      do {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                    *)this_00,
                   (_Link_type)
                   (((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_true>
                      *)&this_00->
                         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
                    )->super__Rb_tree_header)._M_header._M_parent);
        this_00 = this_00 + -1;
        lVar6 = lVar6 + 0x38;
      } while (lVar6 != 0);
    }
  }
  return;
}

Assistant:

void TIntermediate::mergeTrees(TInfoSink& infoSink, TIntermediate& unit)
{
    if (unit.treeRoot == nullptr)
        return;

    if (treeRoot == nullptr) {
        treeRoot = unit.treeRoot;
        return;
    }

    // Getting this far means we have two existing trees to merge...
    numShaderRecordBlocks += unit.numShaderRecordBlocks;
    numTaskNVBlocks += unit.numTaskNVBlocks;

    // Get the top-level globals of each unit
    TIntermSequence& globals = treeRoot->getAsAggregate()->getSequence();
    TIntermSequence& unitGlobals = unit.treeRoot->getAsAggregate()->getSequence();

    // Get the linker-object lists
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    const TIntermSequence& unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // Map by global name to unique ID to rationalize the same object having
    // differing IDs in different trees.
    TIdMaps idMaps;
    long long idShift;
    seedIdMap(idMaps, idShift);
    remapIds(idMaps, idShift + 1, unit);

    mergeBodies(infoSink, globals, unitGlobals);
    bool mergeExistingOnly = false;
    mergeGlobalUniformBlocks(infoSink, unit, mergeExistingOnly);
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());
    ioAccessed.insert(unit.ioAccessed.begin(), unit.ioAccessed.end());
}